

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double inverse_gaussian_sample(double a,double b,int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = normal_01_sample(seed);
  dVar5 = dVar5 * dVar5;
  dVar6 = (b / a) * 4.0 * dVar5 + dVar5 * dVar5;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar5 = ((dVar5 - dVar6) * 0.5) / (b / a) + 1.0;
  iVar1 = (*seed % 0x1f31d) * 0x41a7;
  iVar3 = (*seed / 0x1f31d) * -0xb14;
  iVar2 = iVar1 + iVar3;
  iVar1 = iVar1 + iVar3 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  *seed = iVar1;
  uVar4 = -(ulong)(1.0 < (dVar5 + 1.0) * (double)iVar1 * 4.656612875e-10);
  return (double)(~uVar4 & (ulong)(dVar5 * a) | (ulong)(a / dVar5) & uVar4);
}

Assistant:

double inverse_gaussian_sample ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    INVERSE_GAUSSIAN_SAMPLE samples the Inverse Gaussian PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double INVERSE_GAUSSIAN_SAMPLE, a sample of the PDF.
//
{
  double phi;
  double t;
  double u;
  double x;
  double y;
  double z;

  phi = b / a;
  z = normal_01_sample ( seed );
  y = z * z;

  t = 1.0 + 0.5 * ( y - sqrt ( 4.0 * phi * y + y * y ) ) / phi;
  u = r8_uniform_01 ( seed );

  if ( u * ( 1.0 + t ) <= 1.0 )
  {
    x = a * t;
  }
  else
  {
    x = a / t;
  }

  return x;
}